

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnectionchannel.cpp
# Opt level: O3

bool __thiscall QHttpNetworkConnectionChannel::ensureConnection(QHttpNetworkConnectionChannel *this)

{
  long lVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  Data *pDVar4;
  qsizetype qVar5;
  char cVar6;
  byte bVar7;
  quint16 port;
  SocketState SVar8;
  ProxyType PVar9;
  ConnectionType CVar10;
  QHttpNetworkReply *pQVar11;
  QAbstractSocket *this_00;
  QSslSocket *socket;
  long lVar12;
  QLocalSocket *this_01;
  EVP_PKEY_CTX *in_RSI;
  undefined8 uVar13;
  QHttpNetworkConnectionPrivate *this_02;
  size_t sVar14;
  QArrayData *pQVar15;
  long in_FS_OFFSET;
  QByteArrayView name;
  QByteArrayView name_00;
  QByteArrayView name_01;
  QAnyStringView newValue;
  shared_ptr<QSslContext> sVar16;
  QHttpHeaders h;
  anon_class_1_0_00000001 getState;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_c0;
  QArrayData *local_b8;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_b0;
  undefined1 local_a8 [16];
  QByteArray local_98;
  QString local_78;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this[0x19] == (QHttpNetworkConnectionChannel)0x0) {
    init(this,in_RSI);
  }
  local_58.d.d = (Data *)CONCAT71(local_58.d.d._1_7_,0xaa);
  SVar8 = QSocketAbstraction::
          visit<QSocketAbstraction::socketState(QIODevice*)::_lambda(auto:1*)_1_&>
                    ((anon_class_1_0_00000001 *)&local_58,*(QIODevice **)(this + 0x10));
  if (SVar8 == UnconnectedState) {
LAB_00205d23:
    *(undefined4 *)(this + 0x20) = 1;
    this[0x58] = this[0x18];
    *(undefined4 *)(this + 0xb0) = 0;
    *(undefined2 *)(this + 0x70) = 0;
    QAuthenticator::detach((QAuthenticator *)(this + 0x60));
    *(undefined1 *)(*(long *)(this + 0x60) + 0x90) = 0;
    QAuthenticator::detach((QAuthenticator *)(this + 0x68));
    lVar12 = *(long *)(this + 0x68);
    *(undefined1 *)(lVar12 + 0x90) = 0;
    lVar1 = *(long *)(this + 0x60);
    if ((lVar1 != 0) && (*(int *)(lVar1 + 0x94) == 3)) {
      *(undefined4 *)(lVar1 + 0x94) = 0;
    }
    if (*(int *)(lVar12 + 0x94) == 3) {
      *(undefined4 *)(lVar12 + 0x94) = 0;
    }
    this_02 = *(QHttpNetworkConnectionPrivate **)(*(long *)(this + 0xf8) + 8);
    local_78.d.d = (this_02->hostName).d.d;
    local_78.d.ptr = (this_02->hostName).d.ptr;
    local_78.d.size = (this_02->hostName).d.size;
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_78.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
      this_02 = *(QHttpNetworkConnectionPrivate **)(*(long *)(this + 0xf8) + 8);
    }
    port = this_02->port;
    pQVar11 = QHttpNetworkConnectionPrivate::predictNextRequestsReply(this_02);
    if (pQVar11 == (QHttpNetworkReply *)0x0) {
      lVar12 = *(long *)(this + 0x80);
      if ((lVar12 != 0) && (*(long *)(lVar12 + 0x30) != 0)) {
        pQVar11 = *(QHttpNetworkReply **)(*(long *)(lVar12 + 0x20) + 0x38);
        goto LAB_00205e5c;
      }
    }
    else {
LAB_00205e5c:
      local_58.d.size = 0;
      local_58.d.ptr = (char16_t *)0x0;
      local_58.d.d = (Data *)0x0;
      QMetaObject::invokeMethodImpl
                (&pQVar11->super_QObject,"socketStartedConnecting",QueuedConnection,1,
                 (void **)&local_58,(char **)&local_58.d.ptr,(QMetaTypeInterface **)&local_58.d.size
                );
    }
    PVar9 = QNetworkProxy::type((QNetworkProxy *)(*(long *)(*(long *)(this + 0xf8) + 8) + 0xc0));
    if ((PVar9 != NoProxy) && (this[0x18] == (QHttpNetworkConnectionChannel)0x0)) {
      QNetworkProxy::hostName
                (&local_58,(QNetworkProxy *)(*(long *)(*(long *)(this + 0xf8) + 8) + 0xc0));
      qVar5 = local_58.d.size;
      pDVar4 = local_58.d.d;
      pcVar3 = local_78.d.ptr;
      pDVar2 = local_78.d.d;
      local_58.d.d = local_78.d.d;
      local_78.d.d = pDVar4;
      local_78.d.ptr = local_58.d.ptr;
      local_58.d.ptr = pcVar3;
      local_58.d.size = local_78.d.size;
      local_78.d.size = qVar5;
      if (&pDVar2->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar2->super_QArrayData,2,0x10);
        }
      }
      port = QNetworkProxy::port((QNetworkProxy *)(*(long *)(*(long *)(this + 0xf8) + 8) + 0xc0));
    }
    this_00 = (QAbstractSocket *)QMetaObject::cast((QObject *)&QAbstractSocket::staticMetaObject);
    if (this_00 != (QAbstractSocket *)0x0) {
      QAbstractSocket::proxy((QAbstractSocket *)&local_58);
      PVar9 = QNetworkProxy::type((QNetworkProxy *)&local_58);
      QNetworkProxy::~QNetworkProxy((QNetworkProxy *)&local_58);
      if (PVar9 == HttpProxy) {
        QHttpNetworkRequest::url((QHttpNetworkRequest *)&local_58);
        cVar6 = QUrl::isEmpty();
        QUrl::~QUrl((QUrl *)&local_58);
        if (cVar6 == '\0') {
          local_98.d.size = 0;
          local_98.d.d = (Data *)0x0;
          local_98.d.ptr = (char *)0x0;
          name_00.m_data = "user-agent";
          name_00.m_size = 10;
          QHttpNetworkRequest::headerField
                    ((QByteArray *)&local_58,(QHttpNetworkRequest *)(this + 0x28),name_00,&local_98)
          ;
          local_c0.m_data_utf16 = local_58.d.ptr;
          sVar14 = local_58.d.size;
          pQVar15 = &(local_58.d.d)->super_QArrayData;
LAB_002060ed:
          local_58.d.size = 0;
          local_58.d.ptr = (char16_t *)0x0;
          local_58.d.d = (Data *)0x0;
          if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
            }
          }
        }
        else {
          CVar10 = QHttpNetworkConnection::connectionType(*(QHttpNetworkConnection **)(this + 0xf8))
          ;
          if (CVar10 == ConnectionTypeHTTP2Direct) {
            lVar12 = *(long *)(this + 0x80);
LAB_00205fd3:
            local_98.d.size = 0;
            local_98.d.d = (Data *)0x0;
            local_98.d.ptr = (char *)0x0;
            name.m_data = "user-agent";
            name.m_size = 10;
            QHttpNetworkRequest::headerField
                      ((QByteArray *)&local_58,
                       (QHttpNetworkRequest *)(*(long *)(lVar12 + 0x20) + 0x28),name,&local_98);
            local_c0.m_data_utf16 = local_58.d.ptr;
            sVar14 = local_58.d.size;
            pQVar15 = &(local_58.d.d)->super_QArrayData;
            goto LAB_002060ed;
          }
          CVar10 = QHttpNetworkConnection::connectionType(*(QHttpNetworkConnection **)(this + 0xf8))
          ;
          if (((CVar10 == ConnectionTypeHTTP2) && (lVar12 = *(long *)(this + 0x80), lVar12 != 0)) &&
             (*(long *)(lVar12 + 0x30) != 0)) goto LAB_00205fd3;
          QHttpNetworkConnectionPrivate::predictNextRequest
                    ((QHttpNetworkConnectionPrivate *)local_a8);
          local_98.d.size = 0;
          local_98.d.d = (Data *)0x0;
          local_98.d.ptr = (char *)0x0;
          name_01.m_data = "user-agent";
          name_01.m_size = 10;
          QHttpNetworkRequest::headerField
                    ((QByteArray *)&local_58,(QHttpNetworkRequest *)local_a8,name_01,&local_98);
          sVar14 = local_58.d.size;
          pQVar15 = &(local_58.d.d)->super_QArrayData;
          local_c0.m_data_utf16 = local_58.d.ptr;
          local_58.d.d = (Data *)0x0;
          local_58.d.ptr = (char16_t *)0x0;
          local_58.d.size = 0;
          if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
            }
          }
          QHttpNetworkRequest::~QHttpNetworkRequest((QHttpNetworkRequest *)local_a8);
        }
        if (sVar14 != 0) {
          local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          QAbstractSocket::proxy((QAbstractSocket *)&local_58);
          local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          QNetworkProxy::headers((QNetworkProxy *)&local_98);
          newValue.m_size = sVar14;
          newValue.field_0.m_data = local_c0.m_data;
          QHttpHeaders::replaceOrAppend((QHttpHeaders *)&local_98,UserAgent,newValue);
          QNetworkProxy::setHeaders((QNetworkProxy *)&local_58,(QHttpHeaders *)&local_98);
          QAbstractSocket::setProxy(this_00,(QNetworkProxy *)&local_58);
          QHttpHeaders::~QHttpHeaders((QHttpHeaders *)&local_98);
          QNetworkProxy::~QNetworkProxy((QNetworkProxy *)&local_58);
        }
        if (pQVar15 != (QArrayData *)0x0) {
          LOCK();
          (pQVar15->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar15->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar15->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar15,1,0x10);
          }
        }
      }
    }
    if (this[0x18] == (QHttpNetworkConnectionChannel)0x1) {
      socket = (QSslSocket *)QMetaObject::cast((QObject *)&QSslSocket::staticMetaObject);
      local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      sVar16 = QHttpNetworkConnection::sslContext(*(QHttpNetworkConnection **)(this + 0xf8));
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        local_b8 = &(local_58.d.d)->super_QArrayData;
        local_b0.m_data = local_58.d.ptr;
        local_58.d.d = (Data *)0x0;
        local_58.d.ptr = (char16_t *)0x0;
        sVar16.super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)&local_b8;
        QSslSocketPrivate::checkSettingSslContext(socket,sVar16);
        if (local_b0.m_data != (void *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0.m_data);
        }
      }
      if (local_58.d.ptr != (char16_t *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58.d.ptr);
      }
      QSslSocket::setPeerVerifyName
                (socket,(QString *)(*(long *)(*(long *)(this + 0xf8) + 8) + 0x118));
      QSslSocket::connectToHostEncrypted
                (socket,&local_78,port,(OpenMode)0x3,*(NetworkLayerProtocol *)(this + 0xe8));
      if (this[0x89] == (QHttpNetworkConnectionChannel)0x1) {
        QSslSocket::ignoreSslErrors(socket);
      }
      QSslSocket::ignoreSslErrors(socket,(QList<QSslError> *)(this + 0x90));
LAB_002064ad:
      lVar12 = *(long *)&(socket->super_QTcpSocket).super_QAbstractSocket;
      uVar13 = 0x10000;
LAB_002064b5:
      (**(code **)(lVar12 + 0x108))(socket,uVar13);
    }
    else {
      PVar9 = QNetworkProxy::type((QNetworkProxy *)(*(long *)(*(long *)(this + 0xf8) + 8) + 0xc0));
      if (PVar9 != NoProxy) {
LAB_00206479:
        socket = (QSslSocket *)QMetaObject::cast((QObject *)&QAbstractSocket::staticMetaObject);
        (**(code **)(*(long *)&(socket->super_QTcpSocket).super_QAbstractSocket + 0xf8))
                  (socket,&local_78,port,3,*(undefined4 *)(this + 0xe8));
        goto LAB_002064ad;
      }
      QHttpNetworkConnection::cacheProxy((QHttpNetworkConnection *)&local_58);
      PVar9 = QNetworkProxy::type((QNetworkProxy *)&local_58);
      if (PVar9 != NoProxy) {
        QNetworkProxy::~QNetworkProxy((QNetworkProxy *)&local_58);
        goto LAB_00206479;
      }
      QHttpNetworkConnection::transparentProxy((QHttpNetworkConnection *)&local_98);
      PVar9 = QNetworkProxy::type((QNetworkProxy *)&local_98);
      QNetworkProxy::~QNetworkProxy((QNetworkProxy *)&local_98);
      QNetworkProxy::~QNetworkProxy((QNetworkProxy *)&local_58);
      if (PVar9 != NoProxy) goto LAB_00206479;
      socket = (QSslSocket *)QMetaObject::cast((QObject *)&QAbstractSocket::staticMetaObject);
      if (socket != (QSslSocket *)0x0) {
        (**(code **)(*(long *)&(socket->super_QTcpSocket).super_QAbstractSocket + 0xf8))
                  (socket,&local_78,port,0x23,*(undefined4 *)(this + 0xe8));
        lVar12 = *(long *)&(socket->super_QTcpSocket).super_QAbstractSocket;
        uVar13 = 0x400;
        goto LAB_002064b5;
      }
      this_01 = (QLocalSocket *)QMetaObject::cast((QObject *)&QLocalSocket::staticMetaObject);
      if (this_01 != (QLocalSocket *)0x0) {
        QLocalSocket::connectToServer(this_01,&local_78,(OpenMode)0x3);
      }
    }
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  else if ((SVar8 == ClosingState) || (cVar6 = QIODevice::isOpen(), cVar6 == '\0')) {
    if (*(long *)(this + 0x38) != 0) {
      this[0x50] = (QHttpNetworkConnectionChannel)0x1;
    }
  }
  else if (1 < SVar8 - HostLookupState) {
    if (SVar8 == ConnectedState) {
      bVar7 = (byte)this[0x58] ^ 1;
      goto LAB_002064e3;
    }
    goto LAB_00205d23;
  }
  bVar7 = 0;
LAB_002064e3:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)bVar7;
}

Assistant:

bool QHttpNetworkConnectionChannel::ensureConnection()
{
    if (!isInitialized)
        init();

    QAbstractSocket::SocketState socketState = QSocketAbstraction::socketState(socket);

    // resend this request after we receive the disconnected signal
    // If !socket->isOpen() then we have already called close() on the socket, but there was still a
    // pending connectToHost() for which we hadn't seen a connected() signal, yet. The connected()
    // has now arrived (as indicated by socketState != ClosingState), but we cannot send anything on
    // such a socket anymore.
    if (socketState == QAbstractSocket::ClosingState ||
            (socketState != QAbstractSocket::UnconnectedState && !socket->isOpen())) {
        if (reply)
            resendCurrent = true;
        return false;
    }

    // already trying to connect?
    if (socketState == QAbstractSocket::HostLookupState ||
        socketState == QAbstractSocket::ConnectingState) {
        return false;
    }

    // make sure that this socket is in a connected state, if not initiate
    // connection to the host.
    if (socketState != QAbstractSocket::ConnectedState) {
        // connect to the host if not already connected.
        state = QHttpNetworkConnectionChannel::ConnectingState;
        pendingEncrypt = ssl;

        // reset state
        pipeliningSupported = PipeliningSupportUnknown;
        authenticationCredentialsSent = false;
        proxyCredentialsSent = false;
        authenticator.detach();
        QAuthenticatorPrivate *priv = QAuthenticatorPrivate::getPrivate(authenticator);
        priv->hasFailed = false;
        proxyAuthenticator.detach();
        priv = QAuthenticatorPrivate::getPrivate(proxyAuthenticator);
        priv->hasFailed = false;

        // This workaround is needed since we use QAuthenticator for NTLM authentication. The "phase == Done"
        // is the usual criteria for emitting authentication signals. The "phase" is set to "Done" when the
        // last header for Authorization is generated by the QAuthenticator. Basic & Digest logic does not
        // check the "phase" for generating the Authorization header. NTLM authentication is a two stage
        // process & needs the "phase". To make sure the QAuthenticator uses the current username/password
        // the phase is reset to Start.
        priv = QAuthenticatorPrivate::getPrivate(authenticator);
        if (priv && priv->phase == QAuthenticatorPrivate::Done)
            priv->phase = QAuthenticatorPrivate::Start;
        priv = QAuthenticatorPrivate::getPrivate(proxyAuthenticator);
        if (priv && priv->phase == QAuthenticatorPrivate::Done)
            priv->phase = QAuthenticatorPrivate::Start;

        QString connectHost = connection->d_func()->hostName;
        quint16 connectPort = connection->d_func()->port;

        QHttpNetworkReply *potentialReply = connection->d_func()->predictNextRequestsReply();
        if (potentialReply) {
            QMetaObject::invokeMethod(potentialReply, "socketStartedConnecting", Qt::QueuedConnection);
        } else if (!h2RequestsToSend.isEmpty()) {
            QMetaObject::invokeMethod(std::as_const(h2RequestsToSend).first().second, "socketStartedConnecting", Qt::QueuedConnection);
        }

#ifndef QT_NO_NETWORKPROXY
        // HTTPS always use transparent proxy.
        if (connection->d_func()->networkProxy.type() != QNetworkProxy::NoProxy && !ssl) {
            connectHost = connection->d_func()->networkProxy.hostName();
            connectPort = connection->d_func()->networkProxy.port();
        }
        if (auto *abSocket = qobject_cast<QAbstractSocket *>(socket);
            abSocket && abSocket->proxy().type() == QNetworkProxy::HttpProxy) {
            // Make user-agent field available to HTTP proxy socket engine (QTBUG-17223)
            QByteArray value;
            // ensureConnection is called before any request has been assigned, but can also be
            // called again if reconnecting
            if (request.url().isEmpty()) {
                if (connection->connectionType()
                            == QHttpNetworkConnection::ConnectionTypeHTTP2Direct
                    || (connection->connectionType() == QHttpNetworkConnection::ConnectionTypeHTTP2
                        && !h2RequestsToSend.isEmpty())) {
                    value = std::as_const(h2RequestsToSend).first().first.headerField("user-agent");
                } else {
                    value = connection->d_func()->predictNextRequest().headerField("user-agent");
                }
            } else {
                value = request.headerField("user-agent");
            }
            if (!value.isEmpty()) {
                QNetworkProxy proxy(abSocket->proxy());
                auto h = proxy.headers();
                h.replaceOrAppend(QHttpHeaders::WellKnownHeader::UserAgent, value);
                proxy.setHeaders(std::move(h));
                abSocket->setProxy(proxy);
            }
        }
#endif
        if (ssl) {
#ifndef QT_NO_SSL
            QSslSocket *sslSocket = qobject_cast<QSslSocket*>(socket);

            // check whether we can re-use an existing SSL session
            // (meaning another socket in this connection has already
            // performed a full handshake)
            if (auto ctx = connection->sslContext())
                QSslSocketPrivate::checkSettingSslContext(sslSocket, std::move(ctx));

            sslSocket->setPeerVerifyName(connection->d_func()->peerVerifyName);
            sslSocket->connectToHostEncrypted(connectHost, connectPort, QIODevice::ReadWrite, networkLayerPreference);
            if (ignoreAllSslErrors)
                sslSocket->ignoreSslErrors();
            sslSocket->ignoreSslErrors(ignoreSslErrorsList);

            // limit the socket read buffer size. we will read everything into
            // the QHttpNetworkReply anyway, so let's grow only that and not
            // here and there.
            sslSocket->setReadBufferSize(64*1024);
#else
            // Need to dequeue the request so that we can emit the error.
            if (!reply)
                connection->d_func()->dequeueRequest(socket);
            connection->d_func()->emitReplyError(socket, reply, QNetworkReply::ProtocolUnknownError);
#endif
        } else {
            // In case of no proxy we can use the Unbuffered QTcpSocket
#ifndef QT_NO_NETWORKPROXY
            if (connection->d_func()->networkProxy.type() == QNetworkProxy::NoProxy
                    && connection->cacheProxy().type() == QNetworkProxy::NoProxy
                    && connection->transparentProxy().type() == QNetworkProxy::NoProxy) {
#endif
                if (auto *s = qobject_cast<QAbstractSocket *>(socket)) {
                    s->connectToHost(connectHost, connectPort,
                                     QIODevice::ReadWrite | QIODevice::Unbuffered,
                                     networkLayerPreference);
                    // For an Unbuffered QTcpSocket, the read buffer size has a special meaning.
                    s->setReadBufferSize(1 * 1024);
#if QT_CONFIG(localserver)
                } else if (auto *s = qobject_cast<QLocalSocket *>(socket)) {
                    s->connectToServer(connectHost);
#endif
                }
#ifndef QT_NO_NETWORKPROXY
            } else {
                auto *s = qobject_cast<QAbstractSocket *>(socket);
                Q_ASSERT(s);
                // limit the socket read buffer size. we will read everything into
                // the QHttpNetworkReply anyway, so let's grow only that and not
                // here and there.
                s->connectToHost(connectHost, connectPort, QIODevice::ReadWrite, networkLayerPreference);
                s->setReadBufferSize(64 * 1024);
            }
#endif
        }
        return false;
    }

    // This code path for ConnectedState
    if (pendingEncrypt) {
        // Let's only be really connected when we have received the encrypted() signal. Else the state machine seems to mess up
        // and corrupt the things sent to the server.
        return false;
    }

    return true;
}